

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roadmap.cpp
# Opt level: O2

void setPreferredVelocities(RVOSimulator *sim)

{
  Vector2 VVar1;
  pointer pRVar2;
  pointer pRVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  Vector2 *pVVar7;
  Vector2 *point1;
  long lVar8;
  int i;
  size_t agentNo;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_64;
  Vector2 local_60;
  float local_58;
  float local_48;
  
  agentNo = 0;
  do {
    sVar6 = RVO::RVOSimulator::getNumAgents(sim);
    if ((long)(int)sVar6 <= (long)agentNo) {
      return;
    }
    lVar8 = 0;
    local_64 = 9e+09;
    local_58 = -NAN;
    for (lVar9 = 0; fVar10 = local_58,
        pRVar2 = roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl.
                 super__Vector_impl_data._M_start,
        lVar9 < (int)(((long)roadmap.
                             super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)roadmap.
                            super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x38); lVar9 = lVar9 + 1) {
      pVVar7 = RVO::RVOSimulator::getAgentPosition(sim,agentNo);
      fVar10 = *(float *)((long)&(pRVar2->position).x_ + lVar8) - pVVar7->x_;
      fVar11 = *(float *)((long)&(pRVar2->position).y_ + lVar8) - pVVar7->y_;
      if (SQRT(fVar10 * fVar10 + fVar11 * fVar11) +
          *(float *)(*(long *)((long)&((roadmap.
                                        super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->distToGoal).
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar8) +
                    (long)goals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[agentNo] * 4) < local_64) {
        point1 = RVO::RVOSimulator::getAgentPosition(sim,agentNo);
        pVVar7 = &(roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl
                   .super__Vector_impl_data._M_start)->position;
        fVar10 = RVO::RVOSimulator::getAgentRadius(sim,agentNo);
        bVar4 = RVO::RVOSimulator::queryVisibility
                          (sim,point1,(Vector2 *)((long)&pVVar7->x_ + lVar8),fVar10);
        pRVar2 = roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (bVar4) {
          pVVar7 = RVO::RVOSimulator::getAgentPosition(sim,agentNo);
          fVar10 = *(float *)((long)&(pRVar2->position).x_ + lVar8) - pVVar7->x_;
          fVar11 = *(float *)((long)&(pRVar2->position).y_ + lVar8) - pVVar7->y_;
          local_64 = SQRT(fVar10 * fVar10 + fVar11 * fVar11) +
                     *(float *)(*(long *)((long)&((roadmap.
                                                  super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 distToGoal).
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + lVar8) +
                               (long)goals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[agentNo] * 4);
          local_58 = (float)lVar9;
        }
      }
      lVar8 = lVar8 + 0x38;
    }
    if (local_58 == -NAN) {
LAB_00106fb6:
      local_60.x_ = 0.0;
      local_60.y_ = 0.0;
    }
    else {
      lVar8 = (long)(int)local_58;
      pVVar7 = RVO::RVOSimulator::getAgentPosition(sim,agentNo);
      pRVar3 = roadmap.super__Vector_base<RoadmapVertex,_std::allocator<RoadmapVertex>_>._M_impl.
               super__Vector_impl_data._M_start;
      fVar11 = pRVar2[lVar8].position.x_ - pVVar7->x_;
      fVar12 = pRVar2[lVar8].position.y_ - pVVar7->y_;
      fVar11 = fVar11 * fVar11 + fVar12 * fVar12;
      if ((fVar11 != 0.0) || (NAN(fVar11))) {
        pVVar7 = RVO::RVOSimulator::getAgentPosition(sim,agentNo);
        VVar1 = pRVar3[lVar8].position;
        fVar10 = VVar1.x_;
        fVar11 = VVar1.y_;
      }
      else {
        iVar5 = goals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[agentNo];
        if (fVar10 == (float)iVar5) goto LAB_00106fb6;
        pVVar7 = RVO::RVOSimulator::getAgentPosition(sim,agentNo);
        VVar1 = pRVar3[iVar5].position;
        fVar10 = VVar1.x_;
        fVar11 = VVar1.y_;
      }
      fVar10 = fVar10 - (*pVVar7).x_;
      fVar11 = fVar11 - (*pVVar7).y_;
      fVar12 = 1.0 / SQRT(fVar10 * fVar10 + fVar11 * fVar11);
      local_60.y_ = fVar12 * fVar11;
      local_60.x_ = fVar12 * fVar10;
    }
    RVO::RVOSimulator::setAgentPrefVelocity(sim,agentNo,&local_60);
    iVar5 = rand();
    fVar10 = (((float)iVar5 + (float)iVar5) * 3.1415927) / 2.1474836e+09;
    iVar5 = rand();
    local_58 = (float)iVar5 * 0.0001 * 4.656613e-10;
    pVVar7 = RVO::RVOSimulator::getAgentPrefVelocity(sim,agentNo);
    local_48 = cosf(fVar10);
    fVar10 = sinf(fVar10);
    local_60.y_ = (*pVVar7).y_ + local_58 * fVar10;
    local_60.x_ = (*pVVar7).x_ + local_58 * local_48;
    RVO::RVOSimulator::setAgentPrefVelocity(sim,agentNo,&local_60);
    agentNo = agentNo + 1;
  } while( true );
}

Assistant:

void setPreferredVelocities(RVO::RVOSimulator *sim)
{
	/*
	 * Set the preferred velocity to be a vector of unit magnitude (speed) in the
	 * direction of the visible roadmap vertex that is on the shortest path to the
	 * goal.
	 */
#ifdef _OPENMP
#pragma omp parallel for
#endif
	for (int i = 0; i < static_cast<int>(sim->getNumAgents()); ++i) {
		float minDist = 9e9f;
		int minVertex = -1;

		for (int j = 0; j < static_cast<int>(roadmap.size()); ++j) {
			if (RVO::abs(roadmap[j].position - sim->getAgentPosition(i)) + roadmap[j].distToGoal[goals[i]] < minDist &&
				sim->queryVisibility(sim->getAgentPosition(i), roadmap[j].position, sim->getAgentRadius(i))) {

				minDist = RVO::abs(roadmap[j].position - sim->getAgentPosition(i)) + roadmap[j].distToGoal[goals[i]];
				minVertex = j;
			}
		}

		if (minVertex == -1) {
			/* No roadmap vertex is visible; should not happen. */
			sim->setAgentPrefVelocity(i, RVO::Vector2(0, 0));
		}
		else {
			if (RVO::absSq(roadmap[minVertex].position -
			               sim->getAgentPosition(i)) == 0.0f) {
				if (minVertex == goals[i]) {
					sim->setAgentPrefVelocity(i, RVO::Vector2());
				}
				else {
					sim->setAgentPrefVelocity(i, RVO::normalize(roadmap[goals[i]].position - sim->getAgentPosition(i)));
				}
			}
			else {
				sim->setAgentPrefVelocity(i, RVO::normalize(roadmap[minVertex].position - sim->getAgentPosition(i)));
			}
		}

		/*
		 * Perturb a little to avoid deadlocks due to perfect symmetry.
		 */
		float angle = std::rand() * 2.0f * M_PI / RAND_MAX;
		float dist = std::rand() * 0.0001f / RAND_MAX;

		sim->setAgentPrefVelocity(i, sim->getAgentPrefVelocity(i) +
		                          dist * RVO::Vector2(std::cos(angle), std::sin(angle)));
	}
}